

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O1

void xlfparser::_infer_token_subtypes<char>
               (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens,
               Options<char> *options,char *formula,size_t size)

{
  ulong uVar1;
  bool bVar2;
  Type TVar3;
  ostream *poVar4;
  out_of_range *this;
  char cVar5;
  pointer pTVar6;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> number_re;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> number_re_ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  char *local_1e0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"^\\d+(\\",6);
  cVar5 = '.';
  if ((options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    cVar5 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
            super__Optional_payload_base<char>._M_payload._M_value;
  }
  local_208._M_dataplus._M_p._0_1_ = cVar5;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_208,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\\d+)?(E[+-]\\d+)?$",0x11);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_1d8,&local_208,0x11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar6 != (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    local_1e0 = formula + 1;
    do {
      uVar1 = pTVar6->m_start;
      if ((size <= uVar1) || (size <= pTVar6->m_end)) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"Token index out of range");
        __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      if (pTVar6->m_type == OperatorInfix) {
        if ((formula[uVar1] == '-') || (formula[uVar1] == '+')) {
          if ((tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
              _M_impl.super__Vector_impl_data._M_start < pTVar6) {
            TVar3 = pTVar6[-1].m_type;
            switch(TVar3) {
            case Operand:
            case OperatorPostfix:
switchD_00106a61_caseD_1:
              pTVar6->m_subtype = Math;
              goto LAB_00106bab;
            case Function:
switchD_00106a61_caseD_2:
              if (((pTVar6[-1].m_subtype == Stop) || (TVar3 == Operand)) ||
                 (TVar3 == OperatorPostfix)) goto switchD_00106a61_caseD_1;
              if (TVar3 == Subexpression) {
                TVar3 = Subexpression;
                goto switchD_00106a61_caseD_5;
              }
              break;
            case Subexpression:
switchD_00106a61_caseD_5:
              if (((TVar3 & ~OperatorInfix) == Operand) || (pTVar6[-1].m_subtype == Stop))
              goto switchD_00106a61_caseD_1;
            }
          }
        }
        else {
          if (formula[uVar1] != '+') {
            if (formula[uVar1] == '@') {
              pTVar6->m_type = OperatorPrefix;
              pTVar6->m_subtype = Intersection;
            }
            goto LAB_00106af3;
          }
          if ((tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
              _M_impl.super__Vector_impl_data._M_start < pTVar6) {
            TVar3 = pTVar6[-1].m_type;
            switch(TVar3) {
            case Operand:
            case OperatorPostfix:
              goto switchD_00106a61_caseD_1;
            case Function:
              goto switchD_00106a61_caseD_2;
            case Subexpression:
              goto switchD_00106a61_caseD_5;
            }
          }
        }
        pTVar6->m_type = OperatorPrefix;
        pTVar6->m_subtype = Math;
      }
      else {
LAB_00106af3:
        if (pTVar6->m_type == Operand) {
          if (pTVar6->m_subtype == None) {
            local_208.field_2._M_allocated_capacity = 0;
            local_208.field_2._8_8_ = 0;
            local_208._M_dataplus._M_p = (pointer)0x0;
            local_208._M_string_length = 0;
            bVar2 = std::__detail::
                    __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (formula + uVar1,local_1e0 + pTVar6->m_end,
                               (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                *)&local_208,&local_1d8,0);
            if (local_208._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_208._M_dataplus._M_p,
                              local_208.field_2._M_allocated_capacity -
                              (long)local_208._M_dataplus._M_p);
            }
            if (bVar2) {
              pTVar6->m_subtype = Number;
            }
            else {
              pTVar6->m_subtype = Range;
            }
          }
        }
        else if ((pTVar6->m_type == OperatorInfix) && (pTVar6->m_subtype == None)) {
          if ((byte)formula[uVar1] - 0x3c < 3) {
            pTVar6->m_subtype = Logical;
          }
          else {
            if (formula[uVar1] != 0x26) goto switchD_00106a61_caseD_1;
            pTVar6->m_subtype = Concatenation;
          }
        }
      }
LAB_00106bab:
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 != (tokens->
                       super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

inline void _infer_token_subtypes(std::vector<Token>& tokens,
                                      const Options<char_type>& options,
                                      const char_type* formula,
                                      size_t size)
    {
        std::basic_stringstream<char_type> number_re_ss;
        number_re_ss << R"(^\d+(\)" << options.decimal_separator.value_or(XLFP_CHAR('.')) << R"(\d+)?(E[+-]\d+)?$)";
        const std::basic_regex<char_type> number_re(number_re_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        for (auto iter = tokens.begin(); iter != tokens.end(); ++iter)
        {
            auto& token = *iter;

            if (token.start() >= size || token.end() >= size)
                throw std::out_of_range("Token index out of range");

            if (token.type() == Token::Type::OperatorInfix && (
                    formula[token.start()] == XLFP_CHAR('-') ||
                    formula[token.start()] == XLFP_CHAR('+')))
            {
                // If the previous token was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('+'))
            {
                // If the previous token  was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('@'))
            {
                // Implicit intersection operator is always a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Intersection);
            }

            if (token.type() == Token::Type::OperatorInfix && token.subtype() == Token::Subtype::None)
            {
                if (formula[token.start()] == XLFP_CHAR('<') ||
                    formula[token.start()] == XLFP_CHAR('>') ||
                    formula[token.start()] == XLFP_CHAR('='))
                {
                    token.subtype(Token::Subtype::Logical);
                }
                else if (formula[token.start()] == XLFP_CHAR('&'))
                {
                    token.subtype(Token::Subtype::Concatenation);
                }
                else
                {
                    token.subtype(Token::Subtype::Math);
                }

                continue;
            }

            // Set the operand type to Number or Range
            if (token.type() == Token::Type::Operand && token.subtype() == Token::Subtype::None)
            {
                if (std::regex_match(&formula[token.start()], &formula[token.end()]+1, number_re))
                {
                    token.subtype(Token::Subtype::Number);
                }
                else
                {
                    token.subtype(Token::Subtype::Range);
                }
            }
        }
    }